

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O2

void __thiscall
xemmai::t_define<xemmai::t_io>::f_derive<xemmai::io::t_file,xemmai::t_sharable>
          (t_define<xemmai::t_io> *this)

{
  t_io *ptVar1;
  t_object *a_value;
  long in_FS_OFFSET;
  
  ptVar1 = this->v_library;
  a_value = t_type_of<xemmai::t_object>::f_derive<xemmai::t_type_of<xemmai::io::t_file>>
                      (*(t_type_of<xemmai::t_object> **)(*(long *)(in_FS_OFFSET + -0x78) + 0x48),
                       (t_object *)&ptVar1[-1].v_symbol_read_line,&this->v_fields);
  t_slot_of<xemmai::t_type_of<xemmai::t_object>_>::f_construct(&ptVar1->v_type_file,a_value);
  return;
}

Assistant:

void f_derive()
	{
		v_library->template f_type_slot<T>().f_construct(v_library->template f_type<T_super>()->template f_derive<t_type_of<T>>(t_object::f_of(v_library), v_fields));
	}